

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O2

int rtmidi_get_compiled_api(RtMidiApi *apis,uint apis_size)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = 1;
  if (apis != (RtMidiApi *)0x0) {
    uVar2 = (ulong)apis_size;
    if (1 < apis_size) {
      uVar2 = 1;
    }
    memcpy(apis,rtmidi_compiled_apis,uVar2 * 4);
    uVar1 = (uint)uVar2;
  }
  return uVar1;
}

Assistant:

int rtmidi_get_compiled_api (enum RtMidiApi *apis, unsigned int apis_size)
{
    unsigned num = rtmidi_num_compiled_apis;
    if (apis) {
        num = (num < apis_size) ? num : apis_size;
        memcpy(apis, rtmidi_compiled_apis, num * sizeof(enum RtMidiApi));
    }
    return (int)num;
}